

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checks.cpp
# Opt level: O0

Result<void> * kernel::SanityChecks(Context *param_1)

{
  bool bVar1;
  string *in_RSI;
  allocator<char> *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  Result<void> *in_stack_ffffffffffffff50;
  Error *error;
  Result<void> *this;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  Error local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __a = in_RDI;
  bVar1 = Random_SanityCheck();
  if (bVar1) {
    util::Result<void>::Result(in_stack_ffffffffffffff50);
  }
  else {
    error = &local_48;
    this = (Result<void> *)&stack0xffffffffffffff97;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,__a);
    Untranslated(in_RSI);
    util::Result<void>::Result(this,error);
    util::Error::~Error((Error *)in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(in_stack_ffffffffffffff48);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Result<void> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<void> SanityChecks(const Context&)
{
    if (!Random_SanityCheck()) {
        return util::Error{Untranslated("OS cryptographic RNG sanity check failure. Aborting.")};
    }

    return {};
}